

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_fast.c
# Opt level: O2

size_t ZSTD_compressBlock_fast_dictMatchState
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  long *iEnd;
  BYTE *pBVar1;
  undefined8 *puVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  ZSTD_matchState_t *pZVar7;
  BYTE *pBVar8;
  long *mEnd;
  BYTE *pBVar9;
  U32 *pUVar10;
  U32 *pUVar11;
  undefined8 uVar12;
  char cVar13;
  ulong uVar14;
  ulong uVar15;
  size_t sVar16;
  long *plVar17;
  BYTE *pBVar18;
  byte bVar19;
  byte bVar20;
  ulong uVar21;
  BYTE *iStart;
  long lVar22;
  long *plVar23;
  int iVar24;
  uint uVar25;
  int *piVar26;
  long lVar27;
  seqDef *psVar28;
  uint uVar29;
  uint uVar30;
  long *plVar31;
  int iVar32;
  ulong uVar33;
  ulong uVar34;
  uint uVar35;
  long *plVar36;
  uint uVar37;
  ulong uVar38;
  uint uVar39;
  ulong uVar40;
  ulong uVar41;
  U32 UVar42;
  long *plVar43;
  long *plVar44;
  uint uVar45;
  uint uVar46;
  long lVar47;
  int iVar48;
  BYTE *pBVar49;
  long *plVar50;
  uint local_114;
  uint local_110;
  BYTE *litLimit_w;
  char *_ptr;
  
  pZVar7 = ms->dictMatchState;
  if (pZVar7 == (ZSTD_matchState_t *)0x0) {
    __assert_fail("ms->dictMatchState != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_fast.c"
                  ,0x29c,
                  "size_t ZSTD_compressBlock_fast_dictMatchState(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t)"
                 );
  }
  uVar3 = (ms->cParams).targetLength;
  uVar21 = (ulong)(uVar3 + (uVar3 == 0));
  pBVar8 = (ms->window).base;
  uVar4 = (ms->window).dictLimit;
  iStart = pBVar8 + uVar4;
  iEnd = (long *)((long)src + srcSize);
  plVar36 = (long *)((long)src + (srcSize - 8));
  uVar5 = (pZVar7->window).dictLimit;
  mEnd = (long *)(pZVar7->window).nextSrc;
  pBVar9 = (pZVar7->window).base;
  pBVar49 = pBVar9 + uVar5;
  uVar35 = (int)mEnd - (int)pBVar9;
  uVar29 = uVar4 - uVar35;
  iVar24 = ((int)src - (int)iStart) + (int)mEnd;
  iVar48 = (int)pBVar49;
  uVar25 = iVar24 - iVar48;
  uVar37 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
  pUVar10 = pZVar7->hashTable;
  uVar30 = (pZVar7->cParams).hashLog;
  iVar32 = (int)pBVar8;
  uVar39 = ((int)iEnd - iVar32) - uVar4;
  uVar45 = (ms->cParams).minMatch;
  pUVar11 = ms->hashTable;
  uVar6 = (ms->cParams).hashLog;
  local_114 = *rep;
  local_110 = rep[1];
  uVar3 = uVar30 + 8;
  uVar14 = (ulong)uVar29;
  bVar19 = (byte)uVar30;
  cVar13 = (char)uVar6;
  plVar31 = (long *)src;
  if (uVar45 == 5) {
    if (uVar37 < uVar39) goto LAB_001bcc1b;
    if (uVar4 < uVar35) goto LAB_001bcc3a;
    if (ms->prefetchCDictTables != 0) {
      for (uVar34 = 0; uVar34 < (ulong)(4L << (bVar19 & 0x3f)); uVar34 = uVar34 + 0x40) {
      }
    }
    if (local_114 <= uVar25) {
      if (local_110 <= uVar25) {
        bVar20 = 0x40 - cVar13;
        plVar50 = iEnd + -4;
        plVar44 = (long *)((long)src + (ulong)(iVar24 == iVar48));
LAB_001bb134:
        if ((long *)(uVar21 + (long)plVar31) <= plVar36) {
          if ((uVar6 < 0x21) && (uVar3 < 0x21)) {
            uVar15 = *plVar44 * -0x30e4432345000000;
            uVar41 = uVar15 >> (0x38 - bVar19 & 0x3f);
            uVar38 = (ulong)pUVar10[uVar41 >> 8];
            uVar41 = uVar41 ^ uVar38;
            plVar17 = plVar44 + 0x20;
            plVar23 = (long *)(uVar21 + (long)plVar31);
            uVar34 = uVar21;
            plVar43 = plVar44;
LAB_001bb1ab:
            plVar44 = plVar23;
            uVar33 = uVar15 >> (bVar20 & 0x3f);
            uVar30 = pUVar11[uVar33];
            UVar42 = (U32)((long)plVar43 - (long)pBVar8);
            uVar45 = (UVar42 - local_114) + 1;
            uVar15 = *plVar44 * -0x30e4432345000000;
            uVar40 = uVar15 >> (0x38 - bVar19 & 0x3f);
            pUVar11[uVar33] = UVar42;
            if ((uVar4 - 1) - uVar45 < 3) {
LAB_001bb22a:
              if ((char)uVar41 == '\0') {
                uVar41 = uVar38 >> 8;
                uVar45 = (uint)(uVar38 >> 8);
                if (((uVar45 <= uVar5) || (*(int *)(pBVar9 + uVar41) != (int)*plVar43)) ||
                   (uVar4 < uVar30)) goto LAB_001bb256;
                uVar30 = UVar42 - (uVar45 + uVar29);
                sVar16 = ZSTD_count_2segments
                                   ((BYTE *)((long)plVar43 + 4),pBVar9 + uVar41 + 4,(BYTE *)iEnd,
                                    (BYTE *)mEnd,iStart);
                for (lVar47 = 0;
                    ((plVar44 = (long *)(lVar47 + (long)plVar43), pBVar49 < pBVar9 + lVar47 + uVar41
                     && (plVar31 < plVar44)) &&
                    (*(BYTE *)((long)plVar43 + lVar47 + -1) == pBVar9[lVar47 + (uVar41 - 1)]));
                    lVar47 = lVar47 + -1) {
                }
                if (uVar30 == 0) goto LAB_001bcd13;
                if (seqStore->maxNbSeq <=
                    (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
                goto LAB_001bcb23;
                if (0x20000 < seqStore->maxNbLit) goto LAB_001bcb61;
                lVar27 = (long)plVar43 - (long)plVar31;
                uVar34 = lVar27 + lVar47;
                plVar17 = (long *)seqStore->lit;
                if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)plVar17 + uVar34))
                goto LAB_001bcb80;
                plVar23 = (long *)(uVar34 + (long)plVar31);
                if (iEnd < plVar23) goto LAB_001bcb9f;
                if (plVar50 < plVar23) goto LAB_001bb604;
                lVar22 = plVar31[1];
                *plVar17 = *plVar31;
                plVar17[1] = lVar22;
                pBVar18 = seqStore->lit;
                if (uVar34 < 0x11) goto LAB_001bb724;
                if (0xffffffffffffffe0 <
                    (ulong)((long)(pBVar18 + 0x10) + (-0x10 - (long)(plVar31 + 2))))
                goto LAB_001bccf4;
                lVar22 = plVar31[3];
                *(long *)(pBVar18 + 0x10) = plVar31[2];
                *(long *)(pBVar18 + 0x18) = lVar22;
                if (0x20 < (long)uVar34) {
                  lVar22 = 0;
                  do {
                    puVar2 = (undefined8 *)((long)plVar31 + lVar22 + 0x20);
                    uVar12 = puVar2[1];
                    pBVar1 = pBVar18 + lVar22 + 0x20;
                    *(undefined8 *)pBVar1 = *puVar2;
                    *(undefined8 *)(pBVar1 + 8) = uVar12;
                    puVar2 = (undefined8 *)((long)plVar31 + lVar22 + 0x30);
                    uVar12 = puVar2[1];
                    *(undefined8 *)(pBVar1 + 0x10) = *puVar2;
                    *(undefined8 *)(pBVar1 + 0x18) = uVar12;
                    lVar22 = lVar22 + 0x20;
                  } while (pBVar1 + 0x20 < pBVar18 + uVar34);
                }
                goto LAB_001bb633;
              }
LAB_001bb256:
              if ((uVar4 < uVar30) &&
                 (piVar26 = (int *)(pBVar8 + uVar30), *piVar26 == (int)*plVar43)) goto LAB_001bb38c;
              uVar34 = (uVar34 + 1) - (ulong)(plVar44 < plVar17);
              if (plVar36 < (long *)((long)plVar44 + uVar34)) goto LAB_001bcaf2;
              plVar17 = plVar17 + (ulong)(plVar17 <= plVar44) * 0x20;
              uVar38 = (ulong)pUVar10[uVar40 >> 8];
              uVar41 = uVar40 ^ uVar38;
              plVar23 = (long *)((long)plVar44 + uVar34);
              plVar43 = plVar44;
              goto LAB_001bb1ab;
            }
            piVar26 = (int *)(pBVar8 + uVar45);
            if (uVar45 < uVar4) {
              piVar26 = (int *)(pBVar9 + (uVar45 - uVar29));
            }
            if (*piVar26 != *(int *)((long)plVar43 + 1)) goto LAB_001bb22a;
            plVar44 = iEnd;
            if (uVar45 < uVar4) {
              plVar44 = mEnd;
            }
            sVar16 = ZSTD_count_2segments
                               ((BYTE *)((long)plVar43 + 5),(BYTE *)(piVar26 + 1),(BYTE *)iEnd,
                                (BYTE *)plVar44,iStart);
            if (seqStore->maxNbSeq <=
                (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
            goto LAB_001bcb23;
            if (0x20000 < seqStore->maxNbLit) goto LAB_001bcb61;
            plVar44 = (long *)((long)plVar43 + 1);
            uVar15 = (long)plVar44 - (long)plVar31;
            plVar17 = (long *)seqStore->lit;
            if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)plVar17 + uVar15))
            goto LAB_001bcb80;
            if (iEnd < plVar44) goto LAB_001bcb9f;
            if (plVar50 < plVar44) {
              ZSTD_safecopyLiterals((BYTE *)plVar17,(BYTE *)plVar31,(BYTE *)plVar44,(BYTE *)plVar50)
              ;
              goto LAB_001bb354;
            }
            lVar47 = plVar31[1];
            *plVar17 = *plVar31;
            plVar17[1] = lVar47;
            pBVar18 = seqStore->lit;
            if (uVar15 < 0x11) {
              seqStore->lit = pBVar18 + uVar15;
              goto LAB_001bb679;
            }
            if (0xffffffffffffffe0 < (ulong)((long)(pBVar18 + 0x10) + (-0x10 - (long)(plVar31 + 2)))
               ) goto LAB_001bccf4;
            lVar47 = plVar31[3];
            *(long *)(pBVar18 + 0x10) = plVar31[2];
            *(long *)(pBVar18 + 0x18) = lVar47;
            if (0x20 < (long)uVar15) {
              lVar47 = 0;
              do {
                puVar2 = (undefined8 *)((long)plVar31 + lVar47 + 0x20);
                uVar12 = puVar2[1];
                pBVar1 = pBVar18 + lVar47 + 0x20;
                *(undefined8 *)pBVar1 = *puVar2;
                *(undefined8 *)(pBVar1 + 8) = uVar12;
                puVar2 = (undefined8 *)((long)plVar31 + lVar47 + 0x30);
                uVar12 = puVar2[1];
                *(undefined8 *)(pBVar1 + 0x10) = *puVar2;
                *(undefined8 *)(pBVar1 + 0x18) = uVar12;
                lVar47 = lVar47 + 0x20;
              } while (pBVar1 + 0x20 < pBVar18 + uVar15);
            }
LAB_001bb354:
            seqStore->lit = seqStore->lit + uVar15;
            if (0xffff < uVar15) {
              if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_001bccd5;
              seqStore->longLengthType = ZSTD_llt_literalLength;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
            }
LAB_001bb679:
            uVar34 = sVar16 + 4;
            psVar28 = seqStore->sequences;
            psVar28->litLength = (U16)uVar15;
            psVar28->offBase = 1;
            if (2 < uVar34) {
              uVar15 = sVar16 + 1;
              uVar30 = local_114;
              if (uVar15 < 0x10000) goto LAB_001bb79d;
              if (seqStore->longLengthType == ZSTD_llt_none) goto LAB_001bb776;
              goto LAB_001bcbdd;
            }
            goto LAB_001bcb42;
          }
          goto LAB_001bcbbe;
        }
        goto LAB_001bcaf2;
      }
      goto LAB_001bcc78;
    }
  }
  else if (uVar45 == 6) {
    if (uVar37 < uVar39) goto LAB_001bcc1b;
    if (uVar4 < uVar35) goto LAB_001bcc3a;
    if (ms->prefetchCDictTables != 0) {
      for (uVar34 = 0; uVar34 < (ulong)(4L << (bVar19 & 0x3f)); uVar34 = uVar34 + 0x40) {
      }
    }
    if (local_114 <= uVar25) {
      if (local_110 <= uVar25) {
        bVar20 = 0x40 - cVar13;
        plVar44 = iEnd + -4;
        plVar50 = (long *)((long)src + (ulong)(iVar24 == iVar48));
LAB_001ba879:
        if ((long *)(uVar21 + (long)plVar31) <= plVar36) {
          if ((uVar6 < 0x21) && (uVar3 < 0x21)) {
            uVar15 = *plVar50 * -0x30e4432340650000;
            uVar41 = uVar15 >> (0x38 - bVar19 & 0x3f);
            uVar38 = (ulong)pUVar10[uVar41 >> 8];
            uVar41 = uVar41 ^ uVar38;
            plVar17 = plVar50 + 0x20;
            plVar23 = (long *)(uVar21 + (long)plVar31);
            uVar34 = uVar21;
            plVar43 = plVar50;
LAB_001ba8e7:
            plVar50 = plVar23;
            uVar33 = uVar15 >> (bVar20 & 0x3f);
            uVar30 = pUVar11[uVar33];
            UVar42 = (U32)((long)plVar43 - (long)pBVar8);
            uVar45 = (UVar42 - local_114) + 1;
            uVar15 = *plVar50 * -0x30e4432340650000;
            uVar40 = uVar15 >> (0x38 - bVar19 & 0x3f);
            pUVar11[uVar33] = UVar42;
            if ((uVar4 - 1) - uVar45 < 3) {
LAB_001ba95e:
              if ((char)uVar41 == '\0') {
                uVar41 = uVar38 >> 8;
                uVar45 = (uint)(uVar38 >> 8);
                if (((uVar45 <= uVar5) || (*(int *)(pBVar9 + uVar41) != (int)*plVar43)) ||
                   (uVar4 < uVar30)) goto LAB_001ba989;
                uVar30 = UVar42 - (uVar45 + uVar29);
                sVar16 = ZSTD_count_2segments
                                   ((BYTE *)((long)plVar43 + 4),pBVar9 + uVar41 + 4,(BYTE *)iEnd,
                                    (BYTE *)mEnd,iStart);
                for (lVar47 = 0;
                    ((plVar50 = (long *)((long)plVar43 + lVar47), pBVar49 < pBVar9 + lVar47 + uVar41
                     && (plVar31 < plVar50)) &&
                    (*(BYTE *)((long)plVar43 + lVar47 + -1) == pBVar9[lVar47 + (uVar41 - 1)]));
                    lVar47 = lVar47 + -1) {
                }
                if (uVar30 == 0) goto LAB_001bcd13;
                if (seqStore->maxNbSeq <=
                    (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
                goto LAB_001bcb23;
                if (0x20000 < seqStore->maxNbLit) goto LAB_001bcb61;
                lVar27 = (long)plVar43 - (long)plVar31;
                uVar34 = lVar27 + lVar47;
                plVar17 = (long *)seqStore->lit;
                if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)plVar17 + uVar34))
                goto LAB_001bcb80;
                plVar23 = (long *)(uVar34 + (long)plVar31);
                if (iEnd < plVar23) goto LAB_001bcb9f;
                if (plVar44 < plVar23) goto LAB_001bad36;
                lVar22 = plVar31[1];
                *plVar17 = *plVar31;
                plVar17[1] = lVar22;
                pBVar18 = seqStore->lit;
                if (uVar34 < 0x11) goto LAB_001bae56;
                if (0xffffffffffffffe0 <
                    (ulong)((long)(pBVar18 + 0x10) + (-0x10 - (long)(plVar31 + 2))))
                goto LAB_001bccf4;
                lVar22 = plVar31[3];
                *(long *)(pBVar18 + 0x10) = plVar31[2];
                *(long *)(pBVar18 + 0x18) = lVar22;
                if (0x20 < (long)uVar34) {
                  lVar22 = 0;
                  do {
                    puVar2 = (undefined8 *)((long)plVar31 + lVar22 + 0x20);
                    uVar12 = puVar2[1];
                    pBVar1 = pBVar18 + lVar22 + 0x20;
                    *(undefined8 *)pBVar1 = *puVar2;
                    *(undefined8 *)(pBVar1 + 8) = uVar12;
                    puVar2 = (undefined8 *)((long)plVar31 + lVar22 + 0x30);
                    uVar12 = puVar2[1];
                    *(undefined8 *)(pBVar1 + 0x10) = *puVar2;
                    *(undefined8 *)(pBVar1 + 0x18) = uVar12;
                    lVar22 = lVar22 + 0x20;
                  } while (pBVar1 + 0x20 < pBVar18 + uVar34);
                }
                goto LAB_001bad65;
              }
LAB_001ba989:
              if ((uVar4 < uVar30) &&
                 (piVar26 = (int *)(pBVar8 + uVar30), *piVar26 == (int)*plVar43)) goto LAB_001baabe;
              uVar34 = (uVar34 + 1) - (ulong)(plVar50 < plVar17);
              if (plVar36 < (long *)((long)plVar50 + uVar34)) goto LAB_001bcaf2;
              plVar17 = plVar17 + (ulong)(plVar17 <= plVar50) * 0x20;
              uVar38 = (ulong)pUVar10[uVar40 >> 8];
              uVar41 = uVar40 ^ uVar38;
              plVar23 = (long *)((long)plVar50 + uVar34);
              plVar43 = plVar50;
              goto LAB_001ba8e7;
            }
            piVar26 = (int *)(pBVar8 + uVar45);
            if (uVar45 < uVar4) {
              piVar26 = (int *)(pBVar9 + (uVar45 - uVar29));
            }
            if (*piVar26 != *(int *)((long)plVar43 + 1)) goto LAB_001ba95e;
            plVar50 = iEnd;
            if (uVar45 < uVar4) {
              plVar50 = mEnd;
            }
            sVar16 = ZSTD_count_2segments
                               ((BYTE *)((long)plVar43 + 5),(BYTE *)(piVar26 + 1),(BYTE *)iEnd,
                                (BYTE *)plVar50,iStart);
            if (seqStore->maxNbSeq <=
                (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
            goto LAB_001bcb23;
            if (0x20000 < seqStore->maxNbLit) goto LAB_001bcb61;
            plVar50 = (long *)((long)plVar43 + 1);
            uVar15 = (long)plVar50 - (long)plVar31;
            plVar17 = (long *)seqStore->lit;
            if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)plVar17 + uVar15))
            goto LAB_001bcb80;
            if (iEnd < plVar50) goto LAB_001bcb9f;
            if (plVar44 < plVar50) {
              ZSTD_safecopyLiterals((BYTE *)plVar17,(BYTE *)plVar31,(BYTE *)plVar50,(BYTE *)plVar44)
              ;
              goto LAB_001baa86;
            }
            lVar47 = plVar31[1];
            *plVar17 = *plVar31;
            plVar17[1] = lVar47;
            pBVar18 = seqStore->lit;
            if (uVar15 < 0x11) {
              seqStore->lit = pBVar18 + uVar15;
              goto LAB_001badab;
            }
            if (0xffffffffffffffe0 < (ulong)((long)(pBVar18 + 0x10) + (-0x10 - (long)(plVar31 + 2)))
               ) goto LAB_001bccf4;
            lVar47 = plVar31[3];
            *(long *)(pBVar18 + 0x10) = plVar31[2];
            *(long *)(pBVar18 + 0x18) = lVar47;
            if (0x20 < (long)uVar15) {
              lVar47 = 0;
              do {
                puVar2 = (undefined8 *)((long)plVar31 + lVar47 + 0x20);
                uVar12 = puVar2[1];
                pBVar1 = pBVar18 + lVar47 + 0x20;
                *(undefined8 *)pBVar1 = *puVar2;
                *(undefined8 *)(pBVar1 + 8) = uVar12;
                puVar2 = (undefined8 *)((long)plVar31 + lVar47 + 0x30);
                uVar12 = puVar2[1];
                *(undefined8 *)(pBVar1 + 0x10) = *puVar2;
                *(undefined8 *)(pBVar1 + 0x18) = uVar12;
                lVar47 = lVar47 + 0x20;
              } while (pBVar1 + 0x20 < pBVar18 + uVar15);
            }
LAB_001baa86:
            seqStore->lit = seqStore->lit + uVar15;
            if (0xffff < uVar15) {
              if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_001bccd5;
              seqStore->longLengthType = ZSTD_llt_literalLength;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
            }
LAB_001badab:
            uVar34 = sVar16 + 4;
            psVar28 = seqStore->sequences;
            psVar28->litLength = (U16)uVar15;
            psVar28->offBase = 1;
            if (2 < uVar34) {
              uVar15 = sVar16 + 1;
              uVar30 = local_114;
              if (uVar15 < 0x10000) goto LAB_001baecf;
              if (seqStore->longLengthType == ZSTD_llt_none) goto LAB_001baea8;
              goto LAB_001bcbdd;
            }
            goto LAB_001bcb42;
          }
          goto LAB_001bcbbe;
        }
        goto LAB_001bcaf2;
      }
      goto LAB_001bcc78;
    }
  }
  else if (uVar45 == 7) {
    if (uVar37 < uVar39) {
LAB_001bcc1b:
      __assert_fail("endIndex - prefixStartIndex <= maxDistance",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_fast.c"
                    ,0x1ee,
                    "size_t ZSTD_compressBlock_fast_dictMatchState_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32, const U32)"
                   );
    }
    if (uVar4 < uVar35) {
LAB_001bcc3a:
      __assert_fail("prefixStartIndex >= (U32)(dictEnd - dictBase)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_fast.c"
                    ,0x1f5,
                    "size_t ZSTD_compressBlock_fast_dictMatchState_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32, const U32)"
                   );
    }
    if (ms->prefetchCDictTables != 0) {
      for (uVar34 = 0; uVar34 < (ulong)(4L << (bVar19 & 0x3f)); uVar34 = uVar34 + 0x40) {
      }
    }
    if (local_114 <= uVar25) {
      if (local_110 <= uVar25) {
        bVar20 = 0x40 - cVar13;
        plVar44 = iEnd + -4;
        plVar50 = (long *)((long)src + (ulong)(iVar24 == iVar48));
LAB_001bba0e:
        if (plVar36 < (long *)(uVar21 + (long)plVar31)) {
LAB_001bcaf2:
          *rep = local_114;
          rep[1] = local_110;
          return (long)iEnd - (long)plVar31;
        }
        if ((0x20 < uVar6) || (0x20 < uVar3)) {
LAB_001bcbbe:
          __assert_fail("hBits <= 32",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,0x342,"size_t ZSTD_hashPtr(const void *, U32, U32)");
        }
        uVar15 = *plVar50 * -0x30e44323405a9d00;
        uVar41 = uVar15 >> (0x38 - bVar19 & 0x3f);
        uVar38 = (ulong)pUVar10[uVar41 >> 8];
        uVar41 = uVar41 ^ uVar38;
        plVar17 = plVar50 + 0x20;
        plVar23 = (long *)(uVar21 + (long)plVar31);
        uVar34 = uVar21;
        plVar43 = plVar50;
LAB_001bba7c:
        plVar50 = plVar23;
        uVar33 = uVar15 >> (bVar20 & 0x3f);
        uVar30 = pUVar11[uVar33];
        UVar42 = (U32)((long)plVar43 - (long)pBVar8);
        uVar45 = (UVar42 - local_114) + 1;
        uVar15 = *plVar50 * -0x30e44323405a9d00;
        uVar40 = uVar15 >> (0x38 - bVar19 & 0x3f);
        pUVar11[uVar33] = UVar42;
        if ((uVar4 - 1) - uVar45 < 3) {
LAB_001bbaf3:
          if ((char)uVar41 == '\0') {
            uVar41 = uVar38 >> 8;
            uVar45 = (uint)(uVar38 >> 8);
            if (((uVar45 <= uVar5) || (*(int *)(pBVar9 + uVar41) != (int)*plVar43)) ||
               (uVar4 < uVar30)) goto LAB_001bbb1e;
            uVar30 = UVar42 - (uVar45 + uVar29);
            sVar16 = ZSTD_count_2segments
                               ((BYTE *)((long)plVar43 + 4),pBVar9 + uVar41 + 4,(BYTE *)iEnd,
                                (BYTE *)mEnd,iStart);
            for (lVar47 = 0;
                ((plVar50 = (long *)((long)plVar43 + lVar47), pBVar49 < pBVar9 + lVar47 + uVar41 &&
                 (plVar31 < plVar50)) &&
                (*(BYTE *)((long)plVar43 + lVar47 + -1) == pBVar9[lVar47 + (uVar41 - 1)]));
                lVar47 = lVar47 + -1) {
            }
            if (uVar30 == 0) {
LAB_001bcd13:
              __assert_fail("(offset)>0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_fast.c"
                            ,0x23b,
                            "size_t ZSTD_compressBlock_fast_dictMatchState_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32, const U32)"
                           );
            }
            if (seqStore->maxNbSeq <=
                (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
            goto LAB_001bcb23;
            if (0x20000 < seqStore->maxNbLit) goto LAB_001bcb61;
            lVar27 = (long)plVar43 - (long)plVar31;
            uVar34 = lVar27 + lVar47;
            plVar17 = (long *)seqStore->lit;
            if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)plVar17 + uVar34))
            goto LAB_001bcb80;
            plVar23 = (long *)(uVar34 + (long)plVar31);
            if (iEnd < plVar23) goto LAB_001bcb9f;
            if (plVar44 < plVar23) goto LAB_001bbecb;
            lVar22 = plVar31[1];
            *plVar17 = *plVar31;
            plVar17[1] = lVar22;
            pBVar18 = seqStore->lit;
            if (uVar34 < 0x11) goto LAB_001bbfeb;
            if (0xffffffffffffffe0 < (ulong)((long)(pBVar18 + 0x10) + (-0x10 - (long)(plVar31 + 2)))
               ) goto LAB_001bccf4;
            lVar22 = plVar31[3];
            *(long *)(pBVar18 + 0x10) = plVar31[2];
            *(long *)(pBVar18 + 0x18) = lVar22;
            if (0x20 < (long)uVar34) {
              lVar22 = 0;
              do {
                puVar2 = (undefined8 *)((long)plVar31 + lVar22 + 0x20);
                uVar12 = puVar2[1];
                pBVar1 = pBVar18 + lVar22 + 0x20;
                *(undefined8 *)pBVar1 = *puVar2;
                *(undefined8 *)(pBVar1 + 8) = uVar12;
                puVar2 = (undefined8 *)((long)plVar31 + lVar22 + 0x30);
                uVar12 = puVar2[1];
                *(undefined8 *)(pBVar1 + 0x10) = *puVar2;
                *(undefined8 *)(pBVar1 + 0x18) = uVar12;
                lVar22 = lVar22 + 0x20;
              } while (pBVar1 + 0x20 < pBVar18 + uVar34);
            }
            goto LAB_001bbefa;
          }
LAB_001bbb1e:
          if ((uVar4 < uVar30) && (piVar26 = (int *)(pBVar8 + uVar30), *piVar26 == (int)*plVar43))
          goto LAB_001bbc53;
          uVar34 = (uVar34 + 1) - (ulong)(plVar50 < plVar17);
          if (plVar36 < (long *)((long)plVar50 + uVar34)) goto LAB_001bcaf2;
          plVar17 = plVar17 + (ulong)(plVar17 <= plVar50) * 0x20;
          uVar38 = (ulong)pUVar10[uVar40 >> 8];
          uVar41 = uVar40 ^ uVar38;
          plVar23 = (long *)((long)plVar50 + uVar34);
          plVar43 = plVar50;
          goto LAB_001bba7c;
        }
        piVar26 = (int *)(pBVar8 + uVar45);
        if (uVar45 < uVar4) {
          piVar26 = (int *)(pBVar9 + (uVar45 - uVar29));
        }
        if (*piVar26 != *(int *)((long)plVar43 + 1)) goto LAB_001bbaf3;
        plVar50 = iEnd;
        if (uVar45 < uVar4) {
          plVar50 = mEnd;
        }
        sVar16 = ZSTD_count_2segments
                           ((BYTE *)((long)plVar43 + 5),(BYTE *)(piVar26 + 1),(BYTE *)iEnd,
                            (BYTE *)plVar50,iStart);
        if (seqStore->maxNbSeq <=
            (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
        goto LAB_001bcb23;
        if (0x20000 < seqStore->maxNbLit) goto LAB_001bcb61;
        plVar50 = (long *)((long)plVar43 + 1);
        uVar15 = (long)plVar50 - (long)plVar31;
        plVar17 = (long *)seqStore->lit;
        if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)plVar17 + uVar15))
        goto LAB_001bcb80;
        if (iEnd < plVar50) goto LAB_001bcb9f;
        if (plVar44 < plVar50) {
          ZSTD_safecopyLiterals((BYTE *)plVar17,(BYTE *)plVar31,(BYTE *)plVar50,(BYTE *)plVar44);
          goto LAB_001bbc1b;
        }
        lVar47 = plVar31[1];
        *plVar17 = *plVar31;
        plVar17[1] = lVar47;
        pBVar18 = seqStore->lit;
        if (uVar15 < 0x11) {
          seqStore->lit = pBVar18 + uVar15;
          goto LAB_001bbf40;
        }
        if (0xffffffffffffffe0 < (ulong)((long)(pBVar18 + 0x10) + (-0x10 - (long)(plVar31 + 2))))
        goto LAB_001bccf4;
        lVar47 = plVar31[3];
        *(long *)(pBVar18 + 0x10) = plVar31[2];
        *(long *)(pBVar18 + 0x18) = lVar47;
        if (0x20 < (long)uVar15) {
          lVar47 = 0;
          do {
            puVar2 = (undefined8 *)((long)plVar31 + lVar47 + 0x20);
            uVar12 = puVar2[1];
            pBVar1 = pBVar18 + lVar47 + 0x20;
            *(undefined8 *)pBVar1 = *puVar2;
            *(undefined8 *)(pBVar1 + 8) = uVar12;
            puVar2 = (undefined8 *)((long)plVar31 + lVar47 + 0x30);
            uVar12 = puVar2[1];
            *(undefined8 *)(pBVar1 + 0x10) = *puVar2;
            *(undefined8 *)(pBVar1 + 0x18) = uVar12;
            lVar47 = lVar47 + 0x20;
          } while (pBVar1 + 0x20 < pBVar18 + uVar15);
        }
LAB_001bbc1b:
        seqStore->lit = seqStore->lit + uVar15;
        if (0xffff < uVar15) {
          if (seqStore->longLengthType != ZSTD_llt_none) {
LAB_001bccd5:
            __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                          ,0x2b2,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          seqStore->longLengthType = ZSTD_llt_literalLength;
          seqStore->longLengthPos =
               (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
        }
LAB_001bbf40:
        uVar34 = sVar16 + 4;
        psVar28 = seqStore->sequences;
        psVar28->litLength = (U16)uVar15;
        psVar28->offBase = 1;
        if (uVar34 < 3) {
LAB_001bcb42:
          __assert_fail("matchLength >= MINMATCH",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,700,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        uVar15 = sVar16 + 1;
        uVar30 = local_114;
        if (uVar15 < 0x10000) goto LAB_001bc064;
        if (seqStore->longLengthType == ZSTD_llt_none) goto LAB_001bc03d;
LAB_001bcbdd:
        __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                      ,0x2bf,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
LAB_001bcc78:
      __assert_fail("offset_2 <= dictAndPrefixLength",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_fast.c"
                    ,0x202,
                    "size_t ZSTD_compressBlock_fast_dictMatchState_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32, const U32)"
                   );
    }
  }
  else {
    if (uVar37 < uVar39) goto LAB_001bcc1b;
    if (uVar4 < uVar35) goto LAB_001bcc3a;
    if (ms->prefetchCDictTables != 0) {
      for (uVar34 = 0; uVar34 < (ulong)(4L << (bVar19 & 0x3f)); uVar34 = uVar34 + 0x40) {
      }
    }
    if (local_114 <= uVar25) {
      if (local_110 <= uVar25) {
        bVar20 = 0x20 - cVar13;
        plVar44 = iEnd + -4;
        plVar50 = (long *)((long)src + (ulong)(iVar24 == iVar48));
LAB_001bc2bd:
        if ((long *)(uVar21 + (long)plVar31) <= plVar36) {
          if ((uVar6 < 0x21) && (uVar3 < 0x21)) {
            uVar45 = (int)*plVar50 * -0x61c8864f;
            uVar25 = uVar45 >> (0x18 - bVar19 & 0x1f);
            uVar30 = pUVar10[uVar25 >> 8];
            uVar25 = uVar25 ^ uVar30;
            plVar17 = plVar50 + 0x20;
            plVar23 = (long *)(uVar21 + (long)plVar31);
            uVar34 = uVar21;
            plVar43 = plVar50;
LAB_001bc327:
            plVar50 = plVar23;
            uVar37 = uVar45 >> (bVar20 & 0x1f);
            uVar35 = pUVar11[uVar37];
            UVar42 = (U32)((long)plVar43 - (long)pBVar8);
            uVar46 = (UVar42 - local_114) + 1;
            uVar45 = (int)*plVar50 * -0x61c8864f;
            uVar39 = uVar45 >> (0x18 - bVar19 & 0x1f);
            pUVar11[uVar37] = UVar42;
            if ((uVar4 - 1) - uVar46 < 3) {
LAB_001bc398:
              if ((char)uVar25 == '\0') {
                uVar30 = uVar30 >> 8;
                uVar15 = (ulong)uVar30;
                if (((uVar30 <= uVar5) || (*(int *)(pBVar9 + uVar15) != (int)*plVar43)) ||
                   (uVar4 < uVar35)) goto LAB_001bc3c3;
                uVar30 = UVar42 - (uVar30 + uVar29);
                sVar16 = ZSTD_count_2segments
                                   ((BYTE *)((long)plVar43 + 4),pBVar9 + uVar15 + 4,(BYTE *)iEnd,
                                    (BYTE *)mEnd,iStart);
                for (lVar47 = 0;
                    ((plVar50 = (long *)((long)plVar43 + lVar47), pBVar49 < pBVar9 + lVar47 + uVar15
                     && (plVar31 < plVar50)) &&
                    (*(BYTE *)((long)plVar43 + lVar47 + -1) == pBVar9[lVar47 + (uVar15 - 1)]));
                    lVar47 = lVar47 + -1) {
                }
                if (uVar30 == 0) goto LAB_001bcd13;
                if (seqStore->maxNbSeq <=
                    (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
                goto LAB_001bcb23;
                if (0x20000 < seqStore->maxNbLit) goto LAB_001bcb61;
                lVar27 = (long)plVar43 - (long)plVar31;
                uVar34 = lVar27 + lVar47;
                plVar17 = (long *)seqStore->lit;
                if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)plVar17 + uVar34))
                goto LAB_001bcb80;
                plVar23 = (long *)(uVar34 + (long)plVar31);
                if (iEnd < plVar23) goto LAB_001bcb9f;
                if (plVar44 < plVar23) goto LAB_001bc76f;
                lVar22 = plVar31[1];
                *plVar17 = *plVar31;
                plVar17[1] = lVar22;
                pBVar18 = seqStore->lit;
                if (uVar34 < 0x11) goto LAB_001bc889;
                if (0xffffffffffffffe0 <
                    (ulong)((long)(pBVar18 + 0x10) + (-0x10 - (long)(plVar31 + 2))))
                goto LAB_001bccf4;
                lVar22 = plVar31[3];
                *(long *)(pBVar18 + 0x10) = plVar31[2];
                *(long *)(pBVar18 + 0x18) = lVar22;
                if (0x20 < (long)uVar34) {
                  lVar22 = 0;
                  do {
                    puVar2 = (undefined8 *)((long)plVar31 + lVar22 + 0x20);
                    uVar12 = puVar2[1];
                    pBVar1 = pBVar18 + lVar22 + 0x20;
                    *(undefined8 *)pBVar1 = *puVar2;
                    *(undefined8 *)(pBVar1 + 8) = uVar12;
                    puVar2 = (undefined8 *)((long)plVar31 + lVar22 + 0x30);
                    uVar12 = puVar2[1];
                    *(undefined8 *)(pBVar1 + 0x10) = *puVar2;
                    *(undefined8 *)(pBVar1 + 0x18) = uVar12;
                    lVar22 = lVar22 + 0x20;
                  } while (pBVar1 + 0x20 < pBVar18 + uVar34);
                }
                goto LAB_001bc798;
              }
LAB_001bc3c3:
              if ((uVar4 < uVar35) &&
                 (piVar26 = (int *)(pBVar8 + uVar35), *piVar26 == (int)*plVar43)) goto LAB_001bc4f7;
              uVar34 = (uVar34 + 1) - (ulong)(plVar50 < plVar17);
              if (plVar36 < (long *)((long)plVar50 + uVar34)) goto LAB_001bcaf2;
              plVar17 = plVar17 + (ulong)(plVar17 <= plVar50) * 0x20;
              uVar30 = pUVar10[uVar39 >> 8];
              uVar25 = uVar39 ^ uVar30;
              plVar23 = (long *)((long)plVar50 + uVar34);
              plVar43 = plVar50;
              goto LAB_001bc327;
            }
            piVar26 = (int *)(pBVar8 + uVar46);
            if (uVar46 < uVar4) {
              piVar26 = (int *)(pBVar9 + (uVar46 - uVar29));
            }
            if (*piVar26 != *(int *)((long)plVar43 + 1)) goto LAB_001bc398;
            plVar50 = iEnd;
            if (uVar46 < uVar4) {
              plVar50 = mEnd;
            }
            sVar16 = ZSTD_count_2segments
                               ((BYTE *)((long)plVar43 + 5),(BYTE *)(piVar26 + 1),(BYTE *)iEnd,
                                (BYTE *)plVar50,iStart);
            if (seqStore->maxNbSeq <=
                (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
            goto LAB_001bcb23;
            if (0x20000 < seqStore->maxNbLit) goto LAB_001bcb61;
            plVar50 = (long *)((long)plVar43 + 1);
            uVar15 = (long)plVar50 - (long)plVar31;
            plVar17 = (long *)seqStore->lit;
            if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)plVar17 + uVar15))
            goto LAB_001bcb80;
            if (iEnd < plVar50) goto LAB_001bcb9f;
            if (plVar44 < plVar50) {
              ZSTD_safecopyLiterals((BYTE *)plVar17,(BYTE *)plVar31,(BYTE *)plVar50,(BYTE *)plVar44)
              ;
              goto LAB_001bc4bf;
            }
            lVar47 = plVar31[1];
            *plVar17 = *plVar31;
            plVar17[1] = lVar47;
            pBVar18 = seqStore->lit;
            if (uVar15 < 0x11) {
              seqStore->lit = pBVar18 + uVar15;
              goto LAB_001bc7de;
            }
            if (0xffffffffffffffe0 < (ulong)((long)(pBVar18 + 0x10) + (-0x10 - (long)(plVar31 + 2)))
               ) goto LAB_001bccf4;
            lVar47 = plVar31[3];
            *(long *)(pBVar18 + 0x10) = plVar31[2];
            *(long *)(pBVar18 + 0x18) = lVar47;
            if (0x20 < (long)uVar15) {
              lVar47 = 0;
              do {
                puVar2 = (undefined8 *)((long)plVar31 + lVar47 + 0x20);
                uVar12 = puVar2[1];
                pBVar1 = pBVar18 + lVar47 + 0x20;
                *(undefined8 *)pBVar1 = *puVar2;
                *(undefined8 *)(pBVar1 + 8) = uVar12;
                puVar2 = (undefined8 *)((long)plVar31 + lVar47 + 0x30);
                uVar12 = puVar2[1];
                *(undefined8 *)(pBVar1 + 0x10) = *puVar2;
                *(undefined8 *)(pBVar1 + 0x18) = uVar12;
                lVar47 = lVar47 + 0x20;
              } while (pBVar1 + 0x20 < pBVar18 + uVar15);
            }
LAB_001bc4bf:
            seqStore->lit = seqStore->lit + uVar15;
            if (0xffff < uVar15) {
              if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_001bccd5;
              seqStore->longLengthType = ZSTD_llt_literalLength;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
            }
LAB_001bc7de:
            uVar34 = sVar16 + 4;
            psVar28 = seqStore->sequences;
            psVar28->litLength = (U16)uVar15;
            psVar28->offBase = 1;
            if (2 < uVar34) {
              uVar15 = sVar16 + 1;
              uVar30 = local_114;
              if (uVar15 < 0x10000) goto LAB_001bc902;
              if (seqStore->longLengthType == ZSTD_llt_none) goto LAB_001bc8db;
              goto LAB_001bcbdd;
            }
            goto LAB_001bcb42;
          }
          goto LAB_001bcbbe;
        }
        goto LAB_001bcaf2;
      }
      goto LAB_001bcc78;
    }
  }
  __assert_fail("offset_1 <= dictAndPrefixLength",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_fast.c"
                ,0x201,
                "size_t ZSTD_compressBlock_fast_dictMatchState_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32, const U32)"
               );
LAB_001bb38c:
  uVar30 = (int)plVar43 - (int)piVar26;
  sVar16 = ZSTD_count((BYTE *)((long)plVar43 + 4),(BYTE *)(piVar26 + 1),(BYTE *)iEnd);
  for (lVar47 = 0;
      ((plVar44 = (long *)(lVar47 + (long)plVar43), iStart < (BYTE *)((long)piVar26 + lVar47) &&
       (plVar31 < plVar44)) &&
      (*(char *)((long)plVar43 + lVar47 + -1) == *(char *)((long)piVar26 + lVar47 + -1)));
      lVar47 = lVar47 + -1) {
  }
  if (uVar30 == 0) goto LAB_001bccb6;
  if (seqStore->maxNbSeq <= (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)
     ) goto LAB_001bcb23;
  if (0x20000 < seqStore->maxNbLit) goto LAB_001bcb61;
  lVar27 = (long)plVar43 - (long)plVar31;
  uVar34 = lVar27 + lVar47;
  plVar17 = (long *)seqStore->lit;
  if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)plVar17 + uVar34)) goto LAB_001bcb80;
  plVar23 = (long *)(uVar34 + (long)plVar31);
  if (iEnd < plVar23) goto LAB_001bcb9f;
  if (plVar50 < plVar23) {
LAB_001bb604:
    ZSTD_safecopyLiterals((BYTE *)plVar17,(BYTE *)plVar31,(BYTE *)plVar23,(BYTE *)plVar50);
  }
  else {
    lVar22 = plVar31[1];
    *plVar17 = *plVar31;
    plVar17[1] = lVar22;
    pBVar18 = seqStore->lit;
    if (uVar34 < 0x11) {
LAB_001bb724:
      seqStore->lit = pBVar18 + uVar34;
      goto LAB_001bb72b;
    }
    if (0xffffffffffffffe0 < (ulong)((long)(pBVar18 + 0x10) + (-0x10 - (long)(plVar31 + 2))))
    goto LAB_001bccf4;
    lVar22 = plVar31[3];
    *(long *)(pBVar18 + 0x10) = plVar31[2];
    *(long *)(pBVar18 + 0x18) = lVar22;
    if (0x20 < (long)uVar34) {
      lVar22 = 0;
      do {
        puVar2 = (undefined8 *)((long)plVar31 + lVar22 + 0x20);
        uVar12 = puVar2[1];
        pBVar1 = pBVar18 + lVar22 + 0x20;
        *(undefined8 *)pBVar1 = *puVar2;
        *(undefined8 *)(pBVar1 + 8) = uVar12;
        puVar2 = (undefined8 *)((long)plVar31 + lVar22 + 0x30);
        uVar12 = puVar2[1];
        *(undefined8 *)(pBVar1 + 0x10) = *puVar2;
        *(undefined8 *)(pBVar1 + 0x18) = uVar12;
        lVar22 = lVar22 + 0x20;
      } while (pBVar1 + 0x20 < pBVar18 + uVar34);
    }
  }
LAB_001bb633:
  seqStore->lit = seqStore->lit + lVar47 + lVar27;
  if (0xffff < uVar34) {
    if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_001bccd5;
    seqStore->longLengthType = ZSTD_llt_literalLength;
    seqStore->longLengthPos =
         (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
  }
LAB_001bb72b:
  uVar34 = (sVar16 - lVar47) + 4;
  psVar28 = seqStore->sequences;
  psVar28->litLength = (short)lVar47 + ((short)plVar43 - (short)plVar31);
  psVar28->offBase = uVar30 + 3;
  if (uVar34 < 3) goto LAB_001bcb42;
  uVar15 = (sVar16 - lVar47) + 1;
  local_110 = local_114;
  if (0xffff < uVar15) {
    if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_001bcbdd;
LAB_001bb776:
    local_114 = uVar30;
    seqStore->longLengthType = ZSTD_llt_matchLength;
    seqStore->longLengthPos = (U32)((ulong)((long)psVar28 - (long)seqStore->sequencesStart) >> 3);
    uVar30 = local_114;
  }
LAB_001bb79d:
  local_114 = uVar30;
  plVar31 = (long *)(uVar34 + (long)plVar44);
  psVar28->mlBase = (U16)uVar15;
  psVar28 = psVar28 + 1;
  seqStore->sequences = psVar28;
  plVar44 = plVar31;
  if (plVar31 <= plVar36) {
    if (pBVar8 + ((long)plVar43 - (long)pBVar8 & 0xffffffffU) + 2 <= src) goto LAB_001bcc97;
    pUVar11[(ulong)(*(long *)(pBVar8 + ((long)plVar43 - (long)pBVar8 & 0xffffffffU) + 2) *
                   -0x30e4432345000000) >> (bVar20 & 0x3f)] = UVar42 + 2;
    pUVar11[(ulong)(*(long *)((long)plVar31 + -2) * -0x30e4432345000000) >> (bVar20 & 0x3f)] =
         ((int)plVar31 + -2) - iVar32;
    uVar30 = local_110;
    for (; local_110 = uVar30, plVar44 = plVar31, plVar31 <= plVar36;
        plVar31 = (long *)((long)plVar31 + sVar16 + 4)) {
      UVar42 = (int)plVar31 - iVar32;
      uVar30 = UVar42 - local_110;
      pBVar18 = pBVar8;
      if (uVar30 < uVar4) {
        pBVar18 = pBVar9 + -uVar14;
      }
      if (((uVar4 - 1) - uVar30 < 3) || (*(int *)(pBVar18 + uVar30) != (int)*plVar31)) break;
      plVar44 = iEnd;
      if (uVar30 < uVar4) {
        plVar44 = mEnd;
      }
      sVar16 = ZSTD_count_2segments
                         ((BYTE *)((long)plVar31 + 4),(BYTE *)((long)(pBVar18 + uVar30) + 4),
                          (BYTE *)iEnd,(BYTE *)plVar44,iStart);
      if (seqStore->maxNbSeq <= (ulong)((long)psVar28 - (long)seqStore->sequencesStart >> 3))
      goto LAB_001bcb23;
      if (0x20000 < seqStore->maxNbLit) goto LAB_001bcb61;
      plVar44 = (long *)seqStore->lit;
      if (seqStore->litStart + seqStore->maxNbLit < plVar44) goto LAB_001bcb80;
      if (iEnd < plVar31) goto LAB_001bcb9f;
      if (plVar50 < plVar31) {
        ZSTD_safecopyLiterals((BYTE *)plVar44,(BYTE *)plVar31,(BYTE *)plVar31,(BYTE *)plVar50);
      }
      else {
        lVar47 = plVar31[1];
        *plVar44 = *plVar31;
        plVar44[1] = lVar47;
      }
      psVar28 = seqStore->sequences;
      psVar28->litLength = 0;
      psVar28->offBase = 1;
      if (sVar16 + 4 < 3) goto LAB_001bcb42;
      if (0xffff < sVar16 + 1) {
        if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_001bcbdd;
        seqStore->longLengthType = ZSTD_llt_matchLength;
        seqStore->longLengthPos =
             (U32)((ulong)((long)psVar28 - (long)seqStore->sequencesStart) >> 3);
      }
      psVar28->mlBase = (U16)(sVar16 + 1);
      psVar28 = psVar28 + 1;
      seqStore->sequences = psVar28;
      pUVar11[(ulong)(*plVar31 * -0x30e4432345000000) >> (bVar20 & 0x3f)] = UVar42;
      uVar30 = local_114;
      local_114 = local_110;
    }
  }
  goto LAB_001bb134;
LAB_001baabe:
  uVar30 = (int)plVar43 - (int)piVar26;
  sVar16 = ZSTD_count((BYTE *)((long)plVar43 + 4),(BYTE *)(piVar26 + 1),(BYTE *)iEnd);
  for (lVar47 = 0;
      ((plVar50 = (long *)((long)plVar43 + lVar47), iStart < (BYTE *)((long)piVar26 + lVar47) &&
       (plVar31 < plVar50)) &&
      (*(char *)((long)plVar43 + lVar47 + -1) == *(char *)((long)piVar26 + lVar47 + -1)));
      lVar47 = lVar47 + -1) {
  }
  if (uVar30 == 0) goto LAB_001bccb6;
  if (seqStore->maxNbSeq <= (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)
     ) goto LAB_001bcb23;
  if (0x20000 < seqStore->maxNbLit) goto LAB_001bcb61;
  lVar27 = (long)plVar43 - (long)plVar31;
  uVar34 = lVar27 + lVar47;
  plVar17 = (long *)seqStore->lit;
  if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)plVar17 + uVar34)) goto LAB_001bcb80;
  plVar23 = (long *)(uVar34 + (long)plVar31);
  if (iEnd < plVar23) goto LAB_001bcb9f;
  if (plVar44 < plVar23) {
LAB_001bad36:
    ZSTD_safecopyLiterals((BYTE *)plVar17,(BYTE *)plVar31,(BYTE *)plVar23,(BYTE *)plVar44);
  }
  else {
    lVar22 = plVar31[1];
    *plVar17 = *plVar31;
    plVar17[1] = lVar22;
    pBVar18 = seqStore->lit;
    if (uVar34 < 0x11) {
LAB_001bae56:
      seqStore->lit = pBVar18 + uVar34;
      goto LAB_001bae5d;
    }
    if (0xffffffffffffffe0 < (ulong)((long)(pBVar18 + 0x10) + (-0x10 - (long)(plVar31 + 2))))
    goto LAB_001bccf4;
    lVar22 = plVar31[3];
    *(long *)(pBVar18 + 0x10) = plVar31[2];
    *(long *)(pBVar18 + 0x18) = lVar22;
    if (0x20 < (long)uVar34) {
      lVar22 = 0;
      do {
        puVar2 = (undefined8 *)((long)plVar31 + lVar22 + 0x20);
        uVar12 = puVar2[1];
        pBVar1 = pBVar18 + lVar22 + 0x20;
        *(undefined8 *)pBVar1 = *puVar2;
        *(undefined8 *)(pBVar1 + 8) = uVar12;
        puVar2 = (undefined8 *)((long)plVar31 + lVar22 + 0x30);
        uVar12 = puVar2[1];
        *(undefined8 *)(pBVar1 + 0x10) = *puVar2;
        *(undefined8 *)(pBVar1 + 0x18) = uVar12;
        lVar22 = lVar22 + 0x20;
      } while (pBVar1 + 0x20 < pBVar18 + uVar34);
    }
  }
LAB_001bad65:
  seqStore->lit = seqStore->lit + lVar47 + lVar27;
  if (0xffff < uVar34) {
    if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_001bccd5;
    seqStore->longLengthType = ZSTD_llt_literalLength;
    seqStore->longLengthPos =
         (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
  }
LAB_001bae5d:
  uVar34 = (sVar16 - lVar47) + 4;
  psVar28 = seqStore->sequences;
  psVar28->litLength = (short)lVar47 + ((short)plVar43 - (short)plVar31);
  psVar28->offBase = uVar30 + 3;
  if (uVar34 < 3) goto LAB_001bcb42;
  uVar15 = (sVar16 - lVar47) + 1;
  local_110 = local_114;
  if (0xffff < uVar15) {
    if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_001bcbdd;
LAB_001baea8:
    local_114 = uVar30;
    seqStore->longLengthType = ZSTD_llt_matchLength;
    seqStore->longLengthPos = (U32)((ulong)((long)psVar28 - (long)seqStore->sequencesStart) >> 3);
    uVar30 = local_114;
  }
LAB_001baecf:
  local_114 = uVar30;
  plVar31 = (long *)(uVar34 + (long)plVar50);
  psVar28->mlBase = (U16)uVar15;
  psVar28 = psVar28 + 1;
  seqStore->sequences = psVar28;
  plVar50 = plVar31;
  if (plVar31 <= plVar36) {
    if (pBVar8 + ((long)plVar43 - (long)pBVar8 & 0xffffffffU) + 2 <= src) goto LAB_001bcc97;
    pUVar11[(ulong)(*(long *)(pBVar8 + ((long)plVar43 - (long)pBVar8 & 0xffffffffU) + 2) *
                   -0x30e4432340650000) >> (bVar20 & 0x3f)] = UVar42 + 2;
    pUVar11[(ulong)(*(long *)((long)plVar31 + -2) * -0x30e4432340650000) >> (bVar20 & 0x3f)] =
         ((int)plVar31 + -2) - iVar32;
    uVar30 = local_110;
    for (; local_110 = uVar30, plVar50 = plVar31, plVar31 <= plVar36;
        plVar31 = (long *)((long)plVar31 + sVar16 + 4)) {
      UVar42 = (int)plVar31 - iVar32;
      uVar30 = UVar42 - local_110;
      pBVar18 = pBVar8;
      if (uVar30 < uVar4) {
        pBVar18 = pBVar9 + -uVar14;
      }
      if (((uVar4 - 1) - uVar30 < 3) || (*(int *)(pBVar18 + uVar30) != (int)*plVar31)) break;
      plVar50 = iEnd;
      if (uVar30 < uVar4) {
        plVar50 = mEnd;
      }
      sVar16 = ZSTD_count_2segments
                         ((BYTE *)((long)plVar31 + 4),(BYTE *)((long)(pBVar18 + uVar30) + 4),
                          (BYTE *)iEnd,(BYTE *)plVar50,iStart);
      if (seqStore->maxNbSeq <= (ulong)((long)psVar28 - (long)seqStore->sequencesStart >> 3))
      goto LAB_001bcb23;
      if (0x20000 < seqStore->maxNbLit) goto LAB_001bcb61;
      plVar50 = (long *)seqStore->lit;
      if (seqStore->litStart + seqStore->maxNbLit < plVar50) goto LAB_001bcb80;
      if (iEnd < plVar31) goto LAB_001bcb9f;
      if (plVar44 < plVar31) {
        ZSTD_safecopyLiterals((BYTE *)plVar50,(BYTE *)plVar31,(BYTE *)plVar31,(BYTE *)plVar44);
      }
      else {
        lVar47 = plVar31[1];
        *plVar50 = *plVar31;
        plVar50[1] = lVar47;
      }
      psVar28 = seqStore->sequences;
      psVar28->litLength = 0;
      psVar28->offBase = 1;
      if (sVar16 + 4 < 3) goto LAB_001bcb42;
      if (0xffff < sVar16 + 1) {
        if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_001bcbdd;
        seqStore->longLengthType = ZSTD_llt_matchLength;
        seqStore->longLengthPos =
             (U32)((ulong)((long)psVar28 - (long)seqStore->sequencesStart) >> 3);
      }
      psVar28->mlBase = (U16)(sVar16 + 1);
      psVar28 = psVar28 + 1;
      seqStore->sequences = psVar28;
      pUVar11[(ulong)(*plVar31 * -0x30e4432340650000) >> (bVar20 & 0x3f)] = UVar42;
      uVar30 = local_114;
      local_114 = local_110;
    }
  }
  goto LAB_001ba879;
LAB_001bc4f7:
  uVar30 = (int)plVar43 - (int)piVar26;
  sVar16 = ZSTD_count((BYTE *)((long)plVar43 + 4),(BYTE *)(piVar26 + 1),(BYTE *)iEnd);
  for (lVar47 = 0;
      ((plVar50 = (long *)((long)plVar43 + lVar47), iStart < (BYTE *)((long)piVar26 + lVar47) &&
       (plVar31 < plVar50)) &&
      (*(char *)((long)plVar43 + lVar47 + -1) == *(char *)((long)piVar26 + lVar47 + -1)));
      lVar47 = lVar47 + -1) {
  }
  if (uVar30 == 0) goto LAB_001bccb6;
  if (seqStore->maxNbSeq <= (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)
     ) goto LAB_001bcb23;
  if (0x20000 < seqStore->maxNbLit) goto LAB_001bcb61;
  lVar27 = (long)plVar43 - (long)plVar31;
  uVar34 = lVar27 + lVar47;
  plVar17 = (long *)seqStore->lit;
  if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)plVar17 + uVar34)) goto LAB_001bcb80;
  plVar23 = (long *)(uVar34 + (long)plVar31);
  if (iEnd < plVar23) goto LAB_001bcb9f;
  if (plVar44 < plVar23) {
LAB_001bc76f:
    ZSTD_safecopyLiterals((BYTE *)plVar17,(BYTE *)plVar31,(BYTE *)plVar23,(BYTE *)plVar44);
  }
  else {
    lVar22 = plVar31[1];
    *plVar17 = *plVar31;
    plVar17[1] = lVar22;
    pBVar18 = seqStore->lit;
    if (uVar34 < 0x11) {
LAB_001bc889:
      seqStore->lit = pBVar18 + uVar34;
      goto LAB_001bc890;
    }
    if (0xffffffffffffffe0 < (ulong)((long)(pBVar18 + 0x10) + (-0x10 - (long)(plVar31 + 2))))
    goto LAB_001bccf4;
    lVar22 = plVar31[3];
    *(long *)(pBVar18 + 0x10) = plVar31[2];
    *(long *)(pBVar18 + 0x18) = lVar22;
    if (0x20 < (long)uVar34) {
      lVar22 = 0;
      do {
        puVar2 = (undefined8 *)((long)plVar31 + lVar22 + 0x20);
        uVar12 = puVar2[1];
        pBVar1 = pBVar18 + lVar22 + 0x20;
        *(undefined8 *)pBVar1 = *puVar2;
        *(undefined8 *)(pBVar1 + 8) = uVar12;
        puVar2 = (undefined8 *)((long)plVar31 + lVar22 + 0x30);
        uVar12 = puVar2[1];
        *(undefined8 *)(pBVar1 + 0x10) = *puVar2;
        *(undefined8 *)(pBVar1 + 0x18) = uVar12;
        lVar22 = lVar22 + 0x20;
      } while (pBVar1 + 0x20 < pBVar18 + uVar34);
    }
  }
LAB_001bc798:
  seqStore->lit = seqStore->lit + lVar47 + lVar27;
  if (0xffff < uVar34) {
    if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_001bccd5;
    seqStore->longLengthType = ZSTD_llt_literalLength;
    seqStore->longLengthPos =
         (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
  }
LAB_001bc890:
  uVar34 = (sVar16 - lVar47) + 4;
  psVar28 = seqStore->sequences;
  psVar28->litLength = (short)lVar47 + ((short)plVar43 - (short)plVar31);
  psVar28->offBase = uVar30 + 3;
  if (uVar34 < 3) goto LAB_001bcb42;
  uVar15 = (sVar16 - lVar47) + 1;
  local_110 = local_114;
  if (0xffff < uVar15) {
    if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_001bcbdd;
LAB_001bc8db:
    local_114 = uVar30;
    seqStore->longLengthType = ZSTD_llt_matchLength;
    seqStore->longLengthPos = (U32)((ulong)((long)psVar28 - (long)seqStore->sequencesStart) >> 3);
    uVar30 = local_114;
  }
LAB_001bc902:
  local_114 = uVar30;
  plVar31 = (long *)(uVar34 + (long)plVar50);
  psVar28->mlBase = (U16)uVar15;
  psVar28 = psVar28 + 1;
  seqStore->sequences = psVar28;
  plVar50 = plVar31;
  if (plVar31 <= plVar36) {
    if (pBVar8 + ((long)plVar43 - (long)pBVar8 & 0xffffffffU) + 2 <= src) goto LAB_001bcc97;
    pUVar11[(uint)(*(int *)(pBVar8 + ((long)plVar43 - (long)pBVar8 & 0xffffffffU) + 2) * -0x61c8864f
                  ) >> (bVar20 & 0x1f)] = UVar42 + 2;
    pUVar11[(uint)(*(int *)((long)plVar31 + -2) * -0x61c8864f) >> (bVar20 & 0x1f)] =
         ((int)plVar31 + -2) - iVar32;
    uVar30 = local_110;
    for (; local_110 = uVar30, plVar50 = plVar31, plVar31 <= plVar36;
        plVar31 = (long *)((long)plVar31 + sVar16 + 4)) {
      UVar42 = (int)plVar31 - iVar32;
      uVar30 = UVar42 - local_110;
      pBVar18 = pBVar8;
      if (uVar30 < uVar4) {
        pBVar18 = pBVar9 + -uVar14;
      }
      if (((uVar4 - 1) - uVar30 < 3) || (*(int *)(pBVar18 + uVar30) != (int)*plVar31)) break;
      plVar50 = iEnd;
      if (uVar30 < uVar4) {
        plVar50 = mEnd;
      }
      sVar16 = ZSTD_count_2segments
                         ((BYTE *)((long)plVar31 + 4),(BYTE *)((long)(pBVar18 + uVar30) + 4),
                          (BYTE *)iEnd,(BYTE *)plVar50,iStart);
      if (seqStore->maxNbSeq <= (ulong)((long)psVar28 - (long)seqStore->sequencesStart >> 3))
      goto LAB_001bcb23;
      if (0x20000 < seqStore->maxNbLit) goto LAB_001bcb61;
      plVar50 = (long *)seqStore->lit;
      if (seqStore->litStart + seqStore->maxNbLit < plVar50) goto LAB_001bcb80;
      if (iEnd < plVar31) goto LAB_001bcb9f;
      if (plVar44 < plVar31) {
        ZSTD_safecopyLiterals((BYTE *)plVar50,(BYTE *)plVar31,(BYTE *)plVar31,(BYTE *)plVar44);
      }
      else {
        lVar47 = plVar31[1];
        *plVar50 = *plVar31;
        plVar50[1] = lVar47;
      }
      psVar28 = seqStore->sequences;
      psVar28->litLength = 0;
      psVar28->offBase = 1;
      if (sVar16 + 4 < 3) goto LAB_001bcb42;
      if (0xffff < sVar16 + 1) {
        if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_001bcbdd;
        seqStore->longLengthType = ZSTD_llt_matchLength;
        seqStore->longLengthPos =
             (U32)((ulong)((long)psVar28 - (long)seqStore->sequencesStart) >> 3);
      }
      psVar28->mlBase = (U16)(sVar16 + 1);
      psVar28 = psVar28 + 1;
      seqStore->sequences = psVar28;
      pUVar11[(uint)((int)*plVar31 * -0x61c8864f) >> (bVar20 & 0x1f)] = UVar42;
      uVar30 = local_114;
      local_114 = local_110;
    }
  }
  goto LAB_001bc2bd;
LAB_001bbc53:
  uVar30 = (int)plVar43 - (int)piVar26;
  sVar16 = ZSTD_count((BYTE *)((long)plVar43 + 4),(BYTE *)(piVar26 + 1),(BYTE *)iEnd);
  for (lVar47 = 0;
      ((plVar50 = (long *)((long)plVar43 + lVar47), iStart < (BYTE *)((long)piVar26 + lVar47) &&
       (plVar31 < plVar50)) &&
      (*(char *)((long)plVar43 + lVar47 + -1) == *(char *)((long)piVar26 + lVar47 + -1)));
      lVar47 = lVar47 + -1) {
  }
  if (uVar30 == 0) {
LAB_001bccb6:
    __assert_fail("(offset)>0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_fast.c"
                  ,0x24d,
                  "size_t ZSTD_compressBlock_fast_dictMatchState_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32, const U32)"
                 );
  }
  if (seqStore->maxNbSeq <= (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)
     ) {
LAB_001bcb23:
    __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                  ,0x29d,
                  "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                 );
  }
  if (0x20000 < seqStore->maxNbLit) {
LAB_001bcb61:
    __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                  ,0x29f,
                  "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                 );
  }
  lVar27 = (long)plVar43 - (long)plVar31;
  uVar34 = lVar27 + lVar47;
  plVar17 = (long *)seqStore->lit;
  if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)plVar17 + uVar34)) {
LAB_001bcb80:
    __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                  ,0x2a0,
                  "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                 );
  }
  plVar23 = (long *)(uVar34 + (long)plVar31);
  if (iEnd < plVar23) {
LAB_001bcb9f:
    __assert_fail("literals + litLength <= litLimit",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                  ,0x2a1,
                  "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                 );
  }
  if (plVar44 < plVar23) {
LAB_001bbecb:
    ZSTD_safecopyLiterals((BYTE *)plVar17,(BYTE *)plVar31,(BYTE *)plVar23,(BYTE *)plVar44);
  }
  else {
    lVar22 = plVar31[1];
    *plVar17 = *plVar31;
    plVar17[1] = lVar22;
    pBVar18 = seqStore->lit;
    if (uVar34 < 0x11) {
LAB_001bbfeb:
      seqStore->lit = pBVar18 + uVar34;
      goto LAB_001bbff2;
    }
    if (0xffffffffffffffe0 < (ulong)((long)(pBVar18 + 0x10) + (-0x10 - (long)(plVar31 + 2)))) {
LAB_001bccf4:
      __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/../common/zstd_internal.h"
                    ,0xe9,
                    "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)");
    }
    lVar22 = plVar31[3];
    *(long *)(pBVar18 + 0x10) = plVar31[2];
    *(long *)(pBVar18 + 0x18) = lVar22;
    if (0x20 < (long)uVar34) {
      lVar22 = 0;
      do {
        puVar2 = (undefined8 *)((long)plVar31 + lVar22 + 0x20);
        uVar12 = puVar2[1];
        pBVar1 = pBVar18 + lVar22 + 0x20;
        *(undefined8 *)pBVar1 = *puVar2;
        *(undefined8 *)(pBVar1 + 8) = uVar12;
        puVar2 = (undefined8 *)((long)plVar31 + lVar22 + 0x30);
        uVar12 = puVar2[1];
        *(undefined8 *)(pBVar1 + 0x10) = *puVar2;
        *(undefined8 *)(pBVar1 + 0x18) = uVar12;
        lVar22 = lVar22 + 0x20;
      } while (pBVar1 + 0x20 < pBVar18 + uVar34);
    }
  }
LAB_001bbefa:
  seqStore->lit = seqStore->lit + lVar47 + lVar27;
  if (0xffff < uVar34) {
    if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_001bccd5;
    seqStore->longLengthType = ZSTD_llt_literalLength;
    seqStore->longLengthPos =
         (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
  }
LAB_001bbff2:
  uVar34 = (sVar16 - lVar47) + 4;
  psVar28 = seqStore->sequences;
  psVar28->litLength = (short)lVar47 + ((short)plVar43 - (short)plVar31);
  psVar28->offBase = uVar30 + 3;
  if (uVar34 < 3) goto LAB_001bcb42;
  uVar15 = (sVar16 - lVar47) + 1;
  local_110 = local_114;
  if (0xffff < uVar15) {
    if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_001bcbdd;
LAB_001bc03d:
    local_114 = uVar30;
    seqStore->longLengthType = ZSTD_llt_matchLength;
    seqStore->longLengthPos = (U32)((ulong)((long)psVar28 - (long)seqStore->sequencesStart) >> 3);
    uVar30 = local_114;
  }
LAB_001bc064:
  local_114 = uVar30;
  plVar31 = (long *)(uVar34 + (long)plVar50);
  psVar28->mlBase = (U16)uVar15;
  psVar28 = psVar28 + 1;
  seqStore->sequences = psVar28;
  plVar50 = plVar31;
  if (plVar31 <= plVar36) {
    if (pBVar8 + ((long)plVar43 - (long)pBVar8 & 0xffffffffU) + 2 <= src) {
LAB_001bcc97:
      __assert_fail("base+curr+2 > istart",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_fast.c"
                    ,0x269,
                    "size_t ZSTD_compressBlock_fast_dictMatchState_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32, const U32)"
                   );
    }
    pUVar11[(ulong)(*(long *)(pBVar8 + ((long)plVar43 - (long)pBVar8 & 0xffffffffU) + 2) *
                   -0x30e44323405a9d00) >> (bVar20 & 0x3f)] = UVar42 + 2;
    pUVar11[(ulong)(*(long *)((long)plVar31 + -2) * -0x30e44323405a9d00) >> (bVar20 & 0x3f)] =
         ((int)plVar31 + -2) - iVar32;
    uVar30 = local_110;
    for (; local_110 = uVar30, plVar50 = plVar31, plVar31 <= plVar36;
        plVar31 = (long *)((long)plVar31 + sVar16 + 4)) {
      UVar42 = (int)plVar31 - iVar32;
      uVar30 = UVar42 - local_110;
      pBVar18 = pBVar8;
      if (uVar30 < uVar4) {
        pBVar18 = pBVar9 + -uVar14;
      }
      if (((uVar4 - 1) - uVar30 < 3) || (*(int *)(pBVar18 + uVar30) != (int)*plVar31)) break;
      plVar50 = iEnd;
      if (uVar30 < uVar4) {
        plVar50 = mEnd;
      }
      sVar16 = ZSTD_count_2segments
                         ((BYTE *)((long)plVar31 + 4),(BYTE *)((long)(pBVar18 + uVar30) + 4),
                          (BYTE *)iEnd,(BYTE *)plVar50,iStart);
      if (seqStore->maxNbSeq <= (ulong)((long)psVar28 - (long)seqStore->sequencesStart >> 3))
      goto LAB_001bcb23;
      if (0x20000 < seqStore->maxNbLit) goto LAB_001bcb61;
      plVar50 = (long *)seqStore->lit;
      if (seqStore->litStart + seqStore->maxNbLit < plVar50) goto LAB_001bcb80;
      if (iEnd < plVar31) goto LAB_001bcb9f;
      if (plVar44 < plVar31) {
        ZSTD_safecopyLiterals((BYTE *)plVar50,(BYTE *)plVar31,(BYTE *)plVar31,(BYTE *)plVar44);
      }
      else {
        lVar47 = plVar31[1];
        *plVar50 = *plVar31;
        plVar50[1] = lVar47;
      }
      psVar28 = seqStore->sequences;
      psVar28->litLength = 0;
      psVar28->offBase = 1;
      if (sVar16 + 4 < 3) goto LAB_001bcb42;
      if (0xffff < sVar16 + 1) {
        if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_001bcbdd;
        seqStore->longLengthType = ZSTD_llt_matchLength;
        seqStore->longLengthPos =
             (U32)((ulong)((long)psVar28 - (long)seqStore->sequencesStart) >> 3);
      }
      psVar28->mlBase = (U16)(sVar16 + 1);
      psVar28 = psVar28 + 1;
      seqStore->sequences = psVar28;
      pUVar11[(ulong)(*plVar31 * -0x30e44323405a9d00) >> (bVar20 & 0x3f)] = UVar42;
      uVar30 = local_114;
      local_114 = local_110;
    }
  }
  goto LAB_001bba0e;
}

Assistant:

size_t ZSTD_compressBlock_fast_dictMatchState(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    U32 const mls = ms->cParams.minMatch;
    assert(ms->dictMatchState != NULL);
    switch(mls)
    {
    default: /* includes case 3 */
    case 4 :
        return ZSTD_compressBlock_fast_dictMatchState_4_0(ms, seqStore, rep, src, srcSize);
    case 5 :
        return ZSTD_compressBlock_fast_dictMatchState_5_0(ms, seqStore, rep, src, srcSize);
    case 6 :
        return ZSTD_compressBlock_fast_dictMatchState_6_0(ms, seqStore, rep, src, srcSize);
    case 7 :
        return ZSTD_compressBlock_fast_dictMatchState_7_0(ms, seqStore, rep, src, srcSize);
    }
}